

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::OnMemoryInit(SharedValidator *this,Location *loc,Var *segment_var)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  Var VStack_b8;
  Var local_70;
  
  this->expr_loc_ = loc;
  Var::Var(&local_70,0,loc);
  RVar1 = CheckMemoryIndex(this,&local_70,(MemoryType *)0x0);
  Var::~Var(&local_70);
  Var::Var(&VStack_b8,segment_var);
  RVar2 = CheckDataSegmentIndex(this,&VStack_b8);
  Var::~Var(&VStack_b8);
  if (segment_var->type_ == Index) {
    RVar3 = TypeChecker::OnMemoryInit(&this->typechecker_,(segment_var->field_2).index_);
    RVar1.enum_._0_1_ = RVar3.enum_ == Error || (RVar2.enum_ == Error || RVar1.enum_ == Error);
    RVar1.enum_._1_3_ = 0;
    return (Result)RVar1.enum_;
  }
  __assert_fail("is_index()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/ir.h",0x38
                ,"Index wabt::Var::index() const");
}

Assistant:

Result SharedValidator::OnMemoryInit(const Location& loc, Var segment_var) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  result |= CheckMemoryIndex(Var(0, loc));
  result |= CheckDataSegmentIndex(segment_var);
  result |= typechecker_.OnMemoryInit(segment_var.index());
  return result;
}